

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Request_Metrics(FT_Face face,FT_Size_Request req)

{
  FT_Size_Metrics *metrics;
  ushort uVar1;
  FT_Size_Request_Type FVar2;
  FT_Size pFVar3;
  long lVar4;
  FT_Error FVar5;
  ulong uVar6;
  long lVar7;
  long a_;
  FT_Long FVar8;
  long lVar9;
  ulong uVar10;
  ulong b_;
  FT_Fixed b__00;
  
  pFVar3 = face->size;
  metrics = &pFVar3->metrics;
  if ((face->face_flags & 1) == 0) {
    (pFVar3->metrics).descender = 0;
    (pFVar3->metrics).height = 0;
    (pFVar3->metrics).y_scale = 0;
    (pFVar3->metrics).ascender = 0;
    metrics->x_ppem = 0;
    metrics->y_ppem = 0;
    *(undefined4 *)&metrics->field_0x4 = 0;
    (pFVar3->metrics).x_scale = 0;
    (pFVar3->metrics).max_advance = 0;
    (pFVar3->metrics).x_scale = 0x10000;
    (pFVar3->metrics).y_scale = 0x10000;
    goto LAB_001db131;
  }
  FVar2 = req->type;
  switch(FVar2) {
  case FT_SIZE_REQUEST_TYPE_NOMINAL:
    b_ = (ulong)face->units_per_EM;
    uVar6 = b_;
    goto LAB_001dafb8;
  case FT_SIZE_REQUEST_TYPE_REAL_DIM:
    uVar6 = (long)face->ascender - (long)face->descender;
    uVar10 = uVar6;
    break;
  case FT_SIZE_REQUEST_TYPE_BBOX:
    uVar6 = (face->bbox).xMax - (face->bbox).xMin;
    uVar10 = (face->bbox).yMax - (face->bbox).yMin;
    break;
  case FT_SIZE_REQUEST_TYPE_CELL:
    uVar6 = (ulong)face->max_advance_width;
    uVar10 = (long)face->ascender - (long)face->descender;
    break;
  case FT_SIZE_REQUEST_TYPE_SCALES:
    lVar9 = req->width;
    (pFVar3->metrics).x_scale = lVar9;
    b__00 = req->height;
    (pFVar3->metrics).y_scale = b__00;
    if (lVar9 == 0) goto LAB_001db0ca;
    if (b__00 == 0) goto LAB_001db0bb;
    goto LAB_001db0d1;
  default:
    b_ = 0;
    uVar6 = 0;
    goto LAB_001dafb8;
  }
  b_ = -uVar6;
  if (0 < (long)uVar6) {
    b_ = uVar6;
  }
  uVar6 = -uVar10;
  if (0 < (long)uVar10) {
    uVar6 = uVar10;
  }
LAB_001dafb8:
  lVar9 = req->width;
  lVar7 = lVar9;
  if ((ulong)req->horiResolution != 0) {
    lVar7 = (long)((ulong)req->horiResolution * lVar9 + 0x24) / 0x48;
  }
  lVar4 = req->height;
  a_ = lVar4;
  if ((ulong)req->vertResolution != 0) {
    a_ = (long)((ulong)req->vertResolution * lVar4 + 0x24) / 0x48;
  }
  if (lVar9 == 0 || lVar4 != 0) {
    if (uVar6 == 0) {
      return 0x85;
    }
    FVar8 = FT_DivFix(a_,uVar6);
    (pFVar3->metrics).y_scale = FVar8;
    if (lVar9 != 0) goto LAB_001db034;
    lVar9 = (pFVar3->metrics).y_scale;
    (pFVar3->metrics).x_scale = lVar9;
    lVar7 = FT_MulDiv(a_,b_,uVar6);
  }
  else {
LAB_001db034:
    if (b_ == 0) {
      return 0x85;
    }
    lVar9 = FT_DivFix(lVar7,b_);
    (pFVar3->metrics).x_scale = lVar9;
  }
  if (lVar4 == 0) {
    (pFVar3->metrics).y_scale = lVar9;
    a_ = FT_MulDiv(lVar7,uVar6,b_);
  }
  if (FVar2 != FT_SIZE_REQUEST_TYPE_NOMINAL) {
    if (FVar2 == FT_SIZE_REQUEST_TYPE_CELL) {
      b__00 = (pFVar3->metrics).y_scale;
      if (lVar9 < b__00) {
LAB_001db0bb:
        (pFVar3->metrics).y_scale = lVar9;
        b__00 = lVar9;
      }
      else {
LAB_001db0ca:
        lVar9 = b__00;
        (pFVar3->metrics).x_scale = lVar9;
        b__00 = lVar9;
      }
    }
    else {
      b__00 = (pFVar3->metrics).y_scale;
    }
LAB_001db0d1:
    uVar1 = face->units_per_EM;
    lVar7 = FT_MulFix((ulong)uVar1,lVar9);
    a_ = FT_MulFix((ulong)uVar1,b__00);
  }
  lVar9 = lVar7 + 0x20 >> 6;
  FVar5 = 0x17;
  if ((lVar9 < 0x10000) && (lVar7 = a_ + 0x20 >> 6, lVar7 < 0x10000)) {
    (pFVar3->metrics).x_ppem = (FT_UShort)lVar9;
    (pFVar3->metrics).y_ppem = (FT_UShort)lVar7;
    ft_recompute_scaled_metrics(face,metrics);
LAB_001db131:
    FVar5 = 0;
  }
  return FVar5;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Request_Metrics( FT_Face          face,
                      FT_Size_Request  req )
  {
    FT_Error  error = FT_Err_Ok;

    FT_Size_Metrics*  metrics;


    metrics = &face->size->metrics;

    if ( FT_IS_SCALABLE( face ) )
    {
      FT_Long  w = 0, h = 0, scaled_w = 0, scaled_h = 0;


      switch ( req->type )
      {
      case FT_SIZE_REQUEST_TYPE_NOMINAL:
        w = h = face->units_per_EM;
        break;

      case FT_SIZE_REQUEST_TYPE_REAL_DIM:
        w = h = face->ascender - face->descender;
        break;

      case FT_SIZE_REQUEST_TYPE_BBOX:
        w = face->bbox.xMax - face->bbox.xMin;
        h = face->bbox.yMax - face->bbox.yMin;
        break;

      case FT_SIZE_REQUEST_TYPE_CELL:
        w = face->max_advance_width;
        h = face->ascender - face->descender;
        break;

      case FT_SIZE_REQUEST_TYPE_SCALES:
        metrics->x_scale = (FT_Fixed)req->width;
        metrics->y_scale = (FT_Fixed)req->height;
        if ( !metrics->x_scale )
          metrics->x_scale = metrics->y_scale;
        else if ( !metrics->y_scale )
          metrics->y_scale = metrics->x_scale;
        goto Calculate_Ppem;

      case FT_SIZE_REQUEST_TYPE_MAX:
        break;
      }

      /* to be on the safe side */
      if ( w < 0 )
        w = -w;

      if ( h < 0 )
        h = -h;

      scaled_w = FT_REQUEST_WIDTH ( req );
      scaled_h = FT_REQUEST_HEIGHT( req );

      /* determine scales */
      if ( req->height || !req->width )
      {
        if ( h == 0 )
        {
          FT_ERROR(( "FT_Request_Metrics: Divide by zero\n" ));
          error = FT_ERR( Divide_By_Zero );
          goto Exit;
        }

        metrics->y_scale = FT_DivFix( scaled_h, h );
      }

      if ( req->width )
      {
        if ( w == 0 )
        {
          FT_ERROR(( "FT_Request_Metrics: Divide by zero\n" ));
          error = FT_ERR( Divide_By_Zero );
          goto Exit;
        }

        metrics->x_scale = FT_DivFix( scaled_w, w );
      }
      else
      {
        metrics->x_scale = metrics->y_scale;
        scaled_w = FT_MulDiv( scaled_h, w, h );
      }

      if ( !req->height )
      {
        metrics->y_scale = metrics->x_scale;
        scaled_h = FT_MulDiv( scaled_w, h, w );
      }

      if ( req->type == FT_SIZE_REQUEST_TYPE_CELL )
      {
        if ( metrics->y_scale > metrics->x_scale )
          metrics->y_scale = metrics->x_scale;
        else
          metrics->x_scale = metrics->y_scale;
      }

  Calculate_Ppem:
      /* calculate the ppems */
      if ( req->type != FT_SIZE_REQUEST_TYPE_NOMINAL )
      {
        scaled_w = FT_MulFix( face->units_per_EM, metrics->x_scale );
        scaled_h = FT_MulFix( face->units_per_EM, metrics->y_scale );
      }

      scaled_w = ( scaled_w + 32 ) >> 6;
      scaled_h = ( scaled_h + 32 ) >> 6;
      if ( scaled_w > (FT_Long)FT_USHORT_MAX ||
           scaled_h > (FT_Long)FT_USHORT_MAX )
      {
        FT_ERROR(( "FT_Request_Metrics: Resulting ppem size too large\n" ));
        error = FT_ERR( Invalid_Pixel_Size );
        goto Exit;
      }

      metrics->x_ppem = (FT_UShort)scaled_w;
      metrics->y_ppem = (FT_UShort)scaled_h;

      ft_recompute_scaled_metrics( face, metrics );
    }
    else
    {
      FT_ZERO( metrics );
      metrics->x_scale = 1L << 16;
      metrics->y_scale = 1L << 16;
    }

  Exit:
    return error;
  }